

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::PushPlotClipRect(float expand)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 local_18;
  ImVec2 aIStack_10 [2];
  
  IVar1 = (GImPlot->CurrentPlot->PlotRect).Min;
  IVar2 = (GImPlot->CurrentPlot->PlotRect).Max;
  local_18.x = IVar1.x;
  local_18.y = IVar1.y;
  aIStack_10[0].x = IVar2.x;
  aIStack_10[0].y = IVar2.y;
  local_18.y = local_18.y - expand;
  local_18.x = local_18.x - expand;
  aIStack_10[0].y = expand + aIStack_10[0].y;
  aIStack_10[0].x = expand + aIStack_10[0].x;
  ImGui::PushClipRect(&local_18,aIStack_10,true);
  return;
}

Assistant:

void PushPlotClipRect(float expand) {
    ImPlotContext& gp = *GImPlot;
    ImRect rect = gp.CurrentPlot->PlotRect;
    rect.Expand(expand);
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "PushPlotClipRect() needs to be called between BeginPlot() and EndPlot()!");
    ImGui::PushClipRect(rect.Min, rect.Max, true);
}